

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandDc2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  char *pcVar4;
  uint fBalance;
  uint fUpdateLevel;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fBalance = 0;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"blfpvh");
  if (iVar1 == -1) {
    local_4c = 1;
    local_44 = 0;
    fUpdateLevel = 0;
    local_48 = 0;
  }
  else {
    local_4c = 1;
    local_48 = 0;
    fUpdateLevel = 0;
    local_44 = 0;
    fBalance = 0;
    do {
      switch(iVar1 - 0x62U >> 1 | (uint)((iVar1 - 0x62U & 1) != 0) << 0x1f) {
      case 0:
        fBalance = fBalance ^ 1;
        break;
      default:
        Abc_Print(-2,"usage: dc2 [-blfpvh]\n");
        Abc_Print(-2,"\t         performs combinational AIG optimization\n");
        pcVar4 = "yes";
        pcVar3 = "yes";
        if (fBalance == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-b     : toggle internal balancing [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (fUpdateLevel == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-l     : toggle updating level [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (local_4c == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-f     : toggle representing fanouts [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (local_48 == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-p     : toggle power-aware rewriting [default = %s]\n",pcVar3);
        if (local_44 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar4);
        pcVar3 = "\t-h     : print the command usage\n";
        iVar1 = -2;
        goto LAB_0025dd5e;
      case 2:
        local_4c = local_4c ^ 1;
        break;
      case 5:
        fUpdateLevel = fUpdateLevel ^ 1;
        break;
      case 7:
        local_48 = local_48 ^ 1;
        break;
      case 10:
        local_44 = local_44 ^ 1;
      }
      iVar1 = Extra_UtilGetopt(argc,argv,"blfpvh");
    } while (iVar1 != -1);
  }
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    pcVar3 = "Empty network.\n";
  }
  else {
    if (pAVar2->ntkType == ABC_NTK_STRASH) {
      pAVar2 = Abc_NtkDC2(pAVar2,fBalance,fUpdateLevel,local_4c,local_48,local_44);
      if (pAVar2 != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      Abc_Print(-1,"Command has failed.\n");
      return 0;
    }
    pcVar3 = "This command works only for strashed networks.\n";
  }
  iVar1 = -1;
LAB_0025dd5e:
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandDc2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fBalance, fVerbose, fUpdateLevel, fFanout, fPower, c;

    extern Abc_Ntk_t * Abc_NtkDC2( Abc_Ntk_t * pNtk, int fBalance, int fUpdateLevel, int fFanout, int fPower, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fBalance     = 0;
    fVerbose     = 0;
    fUpdateLevel = 0;
    fFanout      = 1;
    fPower       = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "blfpvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'b':
            fBalance ^= 1;
            break;
        case 'l':
            fUpdateLevel ^= 1;
            break;
        case 'f':
            fFanout ^= 1;
            break;
        case 'p':
            fPower ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDC2( pNtk, fBalance, fUpdateLevel, fFanout, fPower, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dc2 [-blfpvh]\n" );
    Abc_Print( -2, "\t         performs combinational AIG optimization\n" );
    Abc_Print( -2, "\t-b     : toggle internal balancing [default = %s]\n", fBalance? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle updating level [default = %s]\n", fUpdateLevel? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle representing fanouts [default = %s]\n", fFanout? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle power-aware rewriting [default = %s]\n", fPower? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}